

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void cut_objects_internal(Am_Object *cmd,Am_Value *new_sel)

{
  Am_Value *list_value;
  Am_Value_List local_60;
  Am_Object local_50 [3];
  Am_Value local_38;
  undefined1 local_28 [8];
  Am_Value_List selected_objs;
  Am_Value *new_sel_local;
  Am_Object *cmd_local;
  
  selected_objs.item = (Am_List_Item *)new_sel;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_28);
  Am_Value::Am_Value(&local_38,new_sel);
  delete_objects_internal(cmd,&local_38);
  Am_Value::~Am_Value(&local_38);
  list_value = Am_Object::Get(cmd,0x16d,0);
  Am_Value_List::operator=((Am_Value_List *)local_28,list_value);
  Am_Object::Am_Object(local_50,cmd);
  Am_Value_List::Am_Value_List(&local_60,(Am_Value_List *)local_28);
  copy_objects_into_clipboard(local_50,&local_60);
  Am_Value_List::~Am_Value_List(&local_60);
  Am_Object::~Am_Object(local_50);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_28);
  return;
}

Assistant:

void
cut_objects_internal(Am_Object &cmd, Am_Value new_sel)
{
  Am_Value_List selected_objs;
  delete_objects_internal(cmd, new_sel); //delete the objects from the screen
  selected_objs = cmd.Get(Am_OBJECT_MODIFIED); //set by delete_objects_proc
  copy_objects_into_clipboard(cmd, selected_objs);
}